

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
::
compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,longdouble kappa,longdouble delta,longdouble theta)

{
  long lVar1;
  bool bVar2;
  int *piVar3;
  bool bVar4;
  int i;
  long lVar5;
  long lVar6;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int k;
  int selected;
  rc_size sizes;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  longdouble local_68;
  longdouble local_58;
  longdouble local_48;
  
  local_48 = kappa;
  local_58 = delta;
  local_68 = theta;
  fmt._M_str = "update-row {} {} {}\n";
  fmt._M_len = 0x14;
  debug_logger<true>::log<long_double,long_double,long_double>
            ((debug_logger<true> *)this,fmt,&local_48,&local_58,&local_68);
  bVar4 = false;
  piVar3 = (first->current)._M_current;
  while (piVar3 != (last->current)._M_current) {
    k = piVar3[-1];
    sparse_matrix<int>::row((sparse_matrix<int> *)&it,(int)this + 0x10);
    solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
    ::decrease_preference
              ((solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                *)this,it.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl,
               (row_iterator)
               it.
               super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
               .super__Tuple_impl<1UL,_baryonyx::sparse_matrix<int>::row_value_*>.
               super__Head_base<1UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl,
               local_68);
    sizes = solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
            ::compute_reduced_costs<baryonyx::bit_array>
                      ((solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                        *)this,it.
                               super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                               .
                               super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                               ._M_head_impl,
                       (row_iterator)
                       it.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                       .super__Tuple_impl<1UL,_baryonyx::sparse_matrix<int>::row_value_*>.
                       super__Head_base<1UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl,x);
    calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*>
              (*(rc_data **)(this + 0x68),*(rc_data **)(this + 0x68) + sizes.r_size,
               *(random_engine **)(this + 8));
    selected = solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
               ::select_variables((solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                                   *)this,&sizes,*(int *)(*(long *)(this + 0x70) + (long)k * 0xc),
                                  *(int *)(*(long *)(this + 0x70) + 4 + (long)k * 0xc));
    fmt_00._M_str = "constraints {}: {} <= ";
    fmt_00._M_len = 0x16;
    debug_logger<true>::log<int,int>
              ((debug_logger<true> *)this,fmt_00,&k,(int *)((long)k * 0xc + *(long *)(this + 0x70)))
    ;
    lVar6 = 0x14;
    for (lVar5 = 0; lVar5 < sizes.r_size; lVar5 = lVar5 + 1) {
      lVar1 = *(long *)(this + 0x68);
      fmt_01._M_str = "{} ({} {}) ";
      fmt_01._M_len = 0xb;
      debug_logger<true>::log<int,long_double,int>
                ((debug_logger<true> *)this,fmt_01,(int *)(lVar1 + -4 + lVar6),
                 (longdouble *)(lVar1 + -0x14 + lVar6),(int *)(lVar1 + lVar6));
      lVar6 = lVar6 + 0x20;
    }
    fmt_02._M_str = "<= {} => Selected: {}\n";
    fmt_02._M_len = 0x16;
    debug_logger<true>::log<int,int>
              ((debug_logger<true> *)this,fmt_02,(int *)(*(long *)(this + 0x70) + 4 + (long)k * 0xc)
               ,&selected);
    bVar2 = affect<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                      ((solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                        *)this,x,
                       it.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl,k,selected,sizes.r_size,local_48,local_58);
    bVar4 = (bool)(bVar4 | bVar2);
    piVar3 = (first->current)._M_current + -1;
    (first->current)._M_current = piVar3;
  }
  return bVar4;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({} {}) ", R[i].f, R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }